

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int push_length_and_tx(uchar **cursor,size_t *max,wally_tx *tx,uint32_t flags)

{
  int iVar1;
  uchar *bytes_out;
  size_t tx_len;
  uint64_t local_30;
  
  iVar1 = wally_tx_get_length(tx,flags,&local_30);
  if (iVar1 == 0) {
    push_varint(cursor,max,local_30);
    iVar1 = 0;
    bytes_out = push_bytes(cursor,max,(void *)0x0,local_30);
    if (bytes_out != (uchar *)0x0) {
      iVar1 = wally_tx_to_bytes(tx,flags,bytes_out,local_30,&local_30);
    }
  }
  return iVar1;
}

Assistant:

static int push_length_and_tx(unsigned char **cursor, size_t *max,
                              const struct wally_tx *tx, uint32_t flags)
{
    int ret;
    size_t tx_len;
    unsigned char *p;

    if ((ret = wally_tx_get_length(tx, flags, &tx_len)) != WALLY_OK)
        return ret;

    push_varint(cursor, max, tx_len);

    /* TODO: convert wally_tx to use push  */
    if (!(p = push_bytes(cursor, max, NULL, tx_len)))
        return WALLY_OK; /* We catch this in caller. */

    return wally_tx_to_bytes(tx, flags, p, tx_len, &tx_len);
}